

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_BL(DisasContext_conflict1 *s,arg_i *a)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->cpu_R[0xe] + (long)tcg_ctx),
                      (long)(int)(s->thumb | (uint)(s->base).pc_next));
  if (((s->base).singlestep_enabled == false) && (s->ss_active != true)) {
    gen_goto_tb(s,0,(ulong)(a->imm + (uint)(s->thumb == 0) * 4 + (int)s->pc_curr + 4));
    return (_Bool)extraout_AL;
  }
  trans_BL_cold_1();
  return (_Bool)extraout_AL_00;
}

Assistant:

static bool trans_BL(DisasContext *s, arg_i *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_R[14], s->base.pc_next | s->thumb);
    gen_jmp(s, read_pc(s) + a->imm);
    return true;
}